

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall
cmCTestMultiProcessHandler::CreateParallelTestCostList(cmCTestMultiProcessHandler *this)

{
  _Rb_tree_header *p_Var1;
  TestMap *this_00;
  _List_node_base *this_01;
  iterator iVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  bool bVar6;
  mapped_type *ppcVar7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  _Base_ptr p_Var9;
  mapped_type *pmVar10;
  _Rb_tree_node_base *p_Var11;
  long lVar12;
  int *__buffer;
  TestList *__range2;
  int *j;
  _List_node_base *p_Var13;
  vector<int,std::allocator<int>> *this_02;
  _List_node_base **pp_Var14;
  _List_node_base *p_Var15;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar16;
  pair<int_*,_long> pVar17;
  TestList sortedCopy;
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
  priorityStack;
  TestSet alreadySortedTests;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_b0;
  long local_a8;
  _List_node_base *local_98;
  _List_base<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
  local_90;
  vector<int,std::allocator<int>> *local_78;
  TestComparator local_70;
  _List_node_base *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_90;
  local_90._M_impl._M_node._M_size = 0;
  local_90._M_impl._M_node.super__List_node_base._M_prev =
       local_90._M_impl._M_node.super__List_node_base._M_next;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>::
  emplace_back<>((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                  *)local_90._M_impl._M_node.super__List_node_base._M_next);
  p_Var9 = (this->Tests).
           super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->Tests).
            super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    p_Var15 = local_90._M_impl._M_node.super__List_node_base._M_prev + 1;
    local_98 = (_List_node_base *)&this->SortedTests;
    do {
      p_Var11 = p_Var9 + 1;
      ppcVar7 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&(this->Properties).
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,(key_type *)p_Var11);
      _Var8 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((this->LastTestsFailed).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->LastTestsFailed).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,*ppcVar7);
      p_Var13 = p_Var15;
      if (_Var8._M_current !=
          (this->LastTestsFailed).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        iVar2._M_current =
             (this->SortedTests).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        ;
        if (iVar2._M_current ==
            (this->SortedTests).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)local_98,iVar2,(int *)p_Var11);
          p_Var13 = (_List_node_base *)&local_60;
        }
        else {
          *iVar2._M_current = p_Var11->_M_color;
          (this->SortedTests).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
               iVar2._M_current + 1;
          p_Var13 = (_List_node_base *)&local_60;
        }
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)p_Var13
                 ,(int *)p_Var11);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
  }
  if (local_90._M_impl._M_node.super__List_node_base._M_prev[3]._M_prev != (_List_node_base *)0x0) {
    this_00 = &this->Tests;
    local_70.Handler = this;
    do {
      p_Var15 = local_90._M_impl._M_node.super__List_node_base._M_prev;
      std::__cxx11::
      list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
      ::emplace_back<>((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                        *)&local_90);
      p_Var13 = local_90._M_impl._M_node.super__List_node_base._M_prev;
      p_Var11 = (_Rb_tree_node_base *)p_Var15[2]._M_prev;
      if (p_Var11 != (_Rb_tree_node_base *)&p_Var15[1]._M_prev) {
        this_01 = local_90._M_impl._M_node.super__List_node_base._M_prev + 1;
        do {
          pmVar10 = std::
                    map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                    ::operator[](&this_00->
                                  super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                                 ,(key_type *)(p_Var11 + 1));
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_range_unique<std::_Rb_tree_const_iterator<int>>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     this_01,(pmVar10->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t.
                             _M_impl.super__Rb_tree_header._M_header._M_left,
                     (_Rb_tree_const_iterator<int>)
                     &(pmVar10->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
                      super__Rb_tree_header);
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        } while (p_Var11 != (_Rb_tree_node_base *)&p_Var15[1]._M_prev);
      }
      this = local_70.Handler;
      p_Var11 = (_Rb_tree_node_base *)p_Var13[2]._M_prev;
      pp_Var14 = &p_Var13[1]._M_prev;
      if (p_Var11 != (_Rb_tree_node_base *)pp_Var14) {
        do {
          pVar16 = std::
                   _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                   equal_range((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                                *)(p_Var15 + 1),(key_type *)(p_Var11 + 1));
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _M_erase_aux((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                        *)(p_Var15 + 1),(_Base_ptr)pVar16.first._M_node,
                       (_Base_ptr)pVar16.second._M_node);
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        } while (p_Var11 != (_Rb_tree_node_base *)pp_Var14);
      }
    } while (local_90._M_impl._M_node.super__List_node_base._M_prev[3]._M_prev !=
             (_List_node_base *)0x0);
  }
  p_Var15 = (_List_node_base *)&local_90;
  std::__cxx11::
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>::
  _M_erase((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
            *)p_Var15,(iterator)local_90._M_impl._M_node.super__List_node_base._M_prev);
  local_68 = local_90._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var15 != local_90._M_impl._M_node.super__List_node_base._M_next) {
    this_02 = (vector<int,std::allocator<int>> *)((long)this + 0x38);
    local_78 = this_02;
    do {
      local_b8._M_current = (int *)0x0;
      _Stack_b0._M_current = (int *)0x0;
      local_a8 = 0;
      local_98 = p_Var15;
      std::vector<int,std::allocator<int>>::_M_range_insert<std::_Rb_tree_const_iterator<int>>
                ((vector<int,std::allocator<int>> *)&local_b8,0,p_Var15->_M_prev[2]._M_prev,
                 &p_Var15->_M_prev[1]._M_prev);
      _Var4._M_current = _Stack_b0._M_current;
      _Var3._M_current = local_b8._M_current;
      p_Var15 = local_98;
      if (local_b8._M_current != _Stack_b0._M_current) {
        lVar12 = (long)_Stack_b0._M_current - (long)local_b8._M_current >> 2;
        pVar17 = std::get_temporary_buffer<int>((lVar12 - (lVar12 + 1 >> 0x3f)) + 1 >> 1);
        lVar12 = pVar17.second;
        __buffer = pVar17.first;
        if (__buffer == (int *)0x0) {
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<TestComparator>>
                    (_Var3,_Var4,(_Iter_comp_iter<TestComparator>)this);
          lVar12 = 0;
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<TestComparator>>
                    (_Var3,_Var4,__buffer,lVar12,(_Iter_comp_iter<TestComparator>)this);
        }
        operator_delete(__buffer,lVar12 << 2);
        _Var3._M_current = local_b8._M_current;
        _Var4._M_current = _Stack_b0._M_current;
        p_Var15 = local_98;
        this_02 = local_78;
      }
      for (; p_Var13 = local_98, _Var5._M_current = _Stack_b0._M_current, local_98 = p_Var15,
          _Var3._M_current != _Stack_b0._M_current; _Var3._M_current = _Var3._M_current + 1) {
        _Stack_b0._M_current = _Var4._M_current;
        bVar6 = ::cm::contains<cmCTestMultiProcessHandler::TestSet,_int,_0>
                          ((TestSet *)&local_60,_Var3._M_current);
        if (!bVar6) {
          iVar2._M_current = *(int **)((long)this + 0x40);
          if (iVar2._M_current == *(int **)((long)this + 0x48)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (this_02,iVar2,_Var3._M_current);
          }
          else {
            *iVar2._M_current = *_Var3._M_current;
            *(int **)((long)this + 0x40) = iVar2._M_current + 1;
          }
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_60,_Var3._M_current);
        }
        _Var4._M_current = _Stack_b0._M_current;
        p_Var15 = local_98;
        local_98 = p_Var13;
        _Stack_b0._M_current = _Var5._M_current;
      }
      _Stack_b0._M_current = _Var4._M_current;
      if (local_b8._M_current != (int *)0x0) {
        operator_delete(local_b8._M_current,local_a8 - (long)local_b8._M_current);
      }
      p_Var15 = p_Var13->_M_prev;
    } while (p_Var15 != local_68);
  }
  std::__cxx11::
  _List_base<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
  ::_M_clear(&local_90);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::CreateParallelTestCostList()
{
  TestSet alreadySortedTests;

  std::list<TestSet> priorityStack;
  priorityStack.emplace_back();
  TestSet& topLevel = priorityStack.back();

  // In parallel test runs add previously failed tests to the front
  // of the cost list and queue other tests for further sorting
  for (auto const& t : this->Tests) {
    if (cm::contains(this->LastTestsFailed, this->Properties[t.first]->Name)) {
      // If the test failed last time, it should be run first.
      this->SortedTests.push_back(t.first);
      alreadySortedTests.insert(t.first);
    } else {
      topLevel.insert(t.first);
    }
  }

  // In parallel test runs repeatedly move dependencies of the tests on
  // the current dependency level to the next level until no
  // further dependencies exist.
  while (!priorityStack.back().empty()) {
    TestSet& previousSet = priorityStack.back();
    priorityStack.emplace_back();
    TestSet& currentSet = priorityStack.back();

    for (auto const& i : previousSet) {
      TestSet const& dependencies = this->Tests[i];
      currentSet.insert(dependencies.begin(), dependencies.end());
    }

    for (auto const& i : currentSet) {
      previousSet.erase(i);
    }
  }

  // Remove the empty dependency level
  priorityStack.pop_back();

  // Reverse iterate over the different dependency levels (deepest first).
  // Sort tests within each level by COST and append them to the cost list.
  for (TestSet const& currentSet : cmReverseRange(priorityStack)) {
    TestList sortedCopy;
    cm::append(sortedCopy, currentSet);
    std::stable_sort(sortedCopy.begin(), sortedCopy.end(),
                     TestComparator(this));

    for (auto const& j : sortedCopy) {
      if (!cm::contains(alreadySortedTests, j)) {
        this->SortedTests.push_back(j);
        alreadySortedTests.insert(j);
      }
    }
  }
}